

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O2

bool __thiscall
r_exec::CTPX::build_mdl
          (CTPX *this,_Fact *cause,_Fact *consequent,GuardBuilder *guard_builder,uint64_t period)

{
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  bool bVar3;
  int iVar4;
  HLPBindingMap *this_00;
  undefined4 extraout_var;
  P<r_exec::HLPBindingMap> this_01;
  Code *mdl;
  uint16_t write_index;
  P<r_exec::HLPBindingMap> bm;
  P<r_code::Code> m0;
  
  this_00 = (HLPBindingMap *)operator_new(0x40);
  HLPBindingMap::HLPBindingMap(this_00);
  LOCK();
  paVar1 = &(this_00->super_BindingMap).super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  p_Var2 = (this->super__TPX).super_TPX.target.object;
  bm.object = (_Object *)this_00;
  iVar4 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
  BindingMap::init((BindingMap *)this_00,(EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar4));
  BindingMap::init((BindingMap *)bm.object,
                   (EVP_PKEY_CTX *)(this->super__TPX).super_TPX.target.object);
  this_01 = bm;
  BindingMap::init((BindingMap *)bm.object,
                   (EVP_PKEY_CTX *)(this->super__TPX).super_TPX.target.object);
  m0.object = &_TPX::build_mdl_head(this_01.object,bm.object,3,cause,consequent,&write_index)->
               super__Object;
  if ((Code *)m0.object == (Code *)0x0) {
    mdl = (Code *)0x0;
  }
  else {
    LOCK();
    paVar1 = &((_Object *)&(m0.object)->_vptr__Object)->refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    mdl = (Code *)m0.object;
  }
  (*(guard_builder->super__Object)._vptr__Object[2])(guard_builder,mdl,0,cause,&write_index);
  _TPX::build_mdl_tail(&this->super__TPX,mdl,write_index);
  bVar3 = build_requirement(this,(HLPBindingMap *)bm.object,(Code *)m0.object,(uint64_t)cause);
  core::P<r_code::Code>::~P(&m0);
  core::P<r_exec::HLPBindingMap>::~P(&bm);
  return bVar3;
}

Assistant:

bool CTPX::build_mdl(_Fact *cause, _Fact *consequent, GuardBuilder *guard_builder, uint64_t period)
{
    P<HLPBindingMap> bm = new HLPBindingMap();
    bm->init(target->get_reference(0), MK_VAL_VALUE);
    bm->init(target, FACT_AFTER);
    bm->init(target, FACT_BEFORE);
    uint16_t write_index;
    P<Code> m0 = build_mdl_head(bm, 3, cause, consequent, write_index);
    guard_builder->build(m0, nullptr, cause, write_index);
    build_mdl_tail(m0, write_index);
    //std::cout<<Utils::RelativeTime(Now())<<" found --------------------- M0\n";
    return build_requirement(bm, m0, period); // existence checks performed there.
}